

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
frozen::knuth_morris_pratt_searcher<2ul>::operator()
          (void *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter;
  long lVar1;
  pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar2;
  pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar3;
  
  lVar1 = 0;
  while( true ) {
    while( true ) {
      if (first._M_current == last._M_current) {
        pVar2.second._M_current = last._M_current;
        pVar2.first._M_current = last._M_current;
        return pVar2;
      }
      if (*(char *)((long)this + lVar1 + 0x10) == *first._M_current) break;
      lVar1 = *(long *)((long)this + lVar1 * 8);
      first._M_current = first._M_current + -(lVar1 >> 0x3f);
      if (lVar1 < 1) {
        lVar1 = 0;
      }
    }
    if (lVar1 == 1) break;
    first._M_current = first._M_current + 1;
    lVar1 = lVar1 + 1;
  }
  pVar3.second._M_current = first._M_current + 1;
  pVar3.first._M_current = first._M_current + -1;
  return pVar3;
}

Assistant:

constexpr std::pair<ForwardIterator, ForwardIterator> operator()(ForwardIterator first, ForwardIterator last) const {
    std::size_t i = 0;
    ForwardIterator iter = first;
    while (iter != last) {
      if (needle_[i] == *iter) {
        if (i == (size - 1))
          return { iter - i, iter - i + size };
        ++i;
        ++iter;
      } else {
        if (step_[i] > -1) {
          i = step_[i];
        } else {
          ++iter;
          i = 0;
        }
      }
    }
    return { last, last };
  }